

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_channel
ma_channel_map_get_channel(ma_channel *pChannelMap,ma_uint32 channelCount,ma_uint32 channelIndex)

{
  ma_channel mVar1;
  
  if (pChannelMap == (ma_channel *)0x0) {
    mVar1 = ma_channel_map_init_standard_channel
                      (ma_standard_channel_map_default,channelCount,channelIndex);
    return mVar1;
  }
  if (channelIndex < channelCount) {
    return pChannelMap[channelIndex];
  }
  return '\0';
}

Assistant:

MA_API ma_channel ma_channel_map_get_channel(const ma_channel* pChannelMap, ma_uint32 channelCount, ma_uint32 channelIndex)
{
    if (pChannelMap == NULL) {
        return ma_channel_map_init_standard_channel(ma_standard_channel_map_default, channelCount, channelIndex);
    } else {
        if (channelIndex >= channelCount) {
            return MA_CHANNEL_NONE;
        }

        return pChannelMap[channelIndex];
    }
}